

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i xy_y_convolve_2tap_4x2_half_pel_sse2(int16_t *src,__m128i *s_64)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  longlong in_RDX;
  __m128i alVar3;
  __m128i s_128 [2];
  __m128i *s_64_local;
  int16_t *src_local;
  
  s_64[1][0] = *(longlong *)(src + 4);
  s_64[1][1] = 0;
  auVar1 = vpunpcklqdq_avx((undefined1  [16])*s_64,(undefined1  [16])s_64[1]);
  (*s_64)[0] = *(longlong *)(src + 8);
  (*s_64)[1] = 0;
  auVar2 = vpunpcklqdq_avx((undefined1  [16])s_64[1],(undefined1  [16])*s_64);
  vpaddw_avx(auVar1,auVar2);
  alVar3[1] = in_RDX;
  alVar3[0] = (longlong)s_64;
  return alVar3;
}

Assistant:

static inline __m128i xy_y_convolve_2tap_4x2_half_pel_sse2(
    const int16_t *const src, __m128i s_64[2]) {
  __m128i s_128[2];

  s_64[1] = _mm_loadl_epi64((__m128i *)(src + 4));
  s_128[0] = _mm_unpacklo_epi64(s_64[0], s_64[1]);
  s_64[0] = _mm_loadl_epi64((__m128i *)(src + 2 * 4));
  s_128[1] = _mm_unpacklo_epi64(s_64[1], s_64[0]);
  return _mm_add_epi16(s_128[0], s_128[1]);
}